

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O0

llama_ubatch * __thiscall llama_sbatch::split_equal(llama_sbatch *this,size_t n_ubatch)

{
  bool bVar1;
  reference pvVar2;
  ulong in_RDX;
  ulong *in_RSI;
  llama_ubatch *in_RDI;
  bool unaff_retaddr;
  size_t in_stack_00000008;
  llama_sbatch *in_stack_00000010;
  llama_sbatch_seq *s;
  size_t i;
  size_t n_tokens_in_ubatch;
  size_t length;
  size_t in_stack_00000078;
  llama_sbatch_seq *in_stack_00000080;
  llama_ubatch *in_stack_00000088;
  llama_sbatch *in_stack_00000090;
  size_t local_58;
  ulong local_50;
  size_type local_28;
  long local_20;
  size_t local_18;
  
  local_50 = in_RDX;
  if (*in_RSI < in_RDX) {
    local_50 = *in_RSI;
  }
  reserve_ubatch(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  bVar1 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::empty
                    ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)in_RDI);
  if (!bVar1) {
    local_18 = 0;
    local_20 = 0;
    pvVar2 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::operator[]
                       ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)(in_RSI + 9),
                        0);
    if (pvVar2->n_seq_id < 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
                 ,0x9f,"GGML_ASSERT(%s) failed","seq[0].n_seq_id > 0");
    }
    local_28 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::size
                         ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)
                          (in_RSI + 9));
    while (local_28 != 0) {
      pvVar2 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::operator[]
                         ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)
                          (in_RSI + 9),local_28 - 1);
      if (pvVar2->length == 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
                   ,0xa4,"GGML_ASSERT(%s) failed","s.length > 0");
      }
      if (local_18 == 0) {
        if (pvVar2->length < local_50) {
          local_58 = pvVar2->length;
        }
        else {
          local_58 = local_50;
        }
        local_18 = local_58;
      }
      add_seq_to_ubatch(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
      local_20 = local_18 + local_20;
      if (1 < pvVar2->n_seq_id) {
        return in_RDI;
      }
      local_28 = local_28 - 1;
      if (local_50 < local_18 + local_20) {
        return in_RDI;
      }
    }
  }
  return in_RDI;
}

Assistant:

llama_ubatch llama_sbatch::split_equal(size_t n_ubatch) {
    n_ubatch = n_tokens < n_ubatch ? n_tokens : n_ubatch;
    llama_ubatch ubatch = reserve_ubatch(n_ubatch, /* has_embd */ batch->embd != nullptr);
    if (!seq.empty()) {
        size_t length = 0;
        size_t n_tokens_in_ubatch = 0;
        GGML_ASSERT(seq[0].n_seq_id > 0); // should not be mixed with simple splits
                                          // smallest first, because it's easier to split this way;
                                          // starting from the end to pop in constant time.
        for (size_t i = seq.size(); i-- > 0;) {
            llama_sbatch_seq & s = seq[i];
            GGML_ASSERT(s.length > 0);
            if (length == 0) {
                length = s.length < n_ubatch ? s.length : n_ubatch;
            }
            add_seq_to_ubatch(ubatch, s, length);
            n_tokens_in_ubatch += length;
            // shared prompts can't be mixed with any of their sequences,
            // so it's safer to compute them in their own ubatch
            if (s.n_seq_id > 1) { break; }
            // stop when there isn't enough space for another sequence
            if (length + n_tokens_in_ubatch > n_ubatch) { break; }
        }
    }
    return ubatch;
}